

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

uint8_t __thiscall ymfm::ym2610::read_data(ym2610 *this)

{
  ushort uVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  uint8_t uVar3;
  
  uVar1 = this->m_address;
  if (uVar1 < 0xe) {
    sVar2 = ssg_engine::read(&this->m_ssg,(uint)uVar1,in_RDX,in_RCX);
    return (uint8_t)sVar2;
  }
  uVar3 = 0xff;
  if (0xf < uVar1) {
    uVar3 = uVar1 == 0xff;
  }
  return uVar3;
}

Assistant:

uint8_t ym2610::read_data()
{
	uint8_t result = 0;
	if (m_address < 0x0e)
	{
		// 00-0D: Read from SSG
		result = m_ssg.read(m_address & 0x0f);
	}
	else if (m_address < 0x10)
	{
		// 0E-0F: I/O ports not supported
		result = 0xff;
	}
	else if (m_address == 0xff)
	{
		// FF: ID code
		result = 1;
	}
	return result;
}